

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::
IMUElasticLocalFrameDynamicalSystem(IMUElasticLocalFrameDynamicalSystem *this,double dt)

{
  StorageBaseType local_167 [3];
  int local_164;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_160;
  StorageBaseType local_13f [3];
  int local_13c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_138;
  StorageBaseType local_117 [3];
  int local_114;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_110;
  StorageBaseType local_ef [3];
  int local_ec;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_e8;
  StorageBaseType local_c7 [3];
  int local_c4;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_c0;
  StorageBaseType local_9f [3];
  int local_9c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_98;
  StorageBaseType local_77 [3];
  int local_74;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_70;
  StorageBaseType local_4f [3];
  int local_4c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_48;
  double local_18;
  double dt_local;
  IMUElasticLocalFrameDynamicalSystem *this_local;
  
  local_18 = dt;
  dt_local = (double)this;
  DynamicalSystemFunctorBase::DynamicalSystemFunctorBase(&this->super_DynamicalSystemFunctorBase);
  algorithm::RigidBodyKinematics::RigidBodyKinematics((RigidBodyKinematics *)this);
  (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
       (_func_int **)&PTR__IMUElasticLocalFrameDynamicalSystem_006b3968;
  AccelerometerGyrometer::AccelerometerGyrometer(&this->sensor_);
  this->processNoise_ = (NoiseBase *)0x0;
  this->dt_ = local_18;
  this->robotMass_ = 56.8;
  this->robotMassInv_ = 0.017605633802816902;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->fc_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->tc_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->dx_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->xk1_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->xk_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->uk_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->xk_fory_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->yk_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->uk_fory_);
  this->measurementSize_ = 6;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&this->contactPositions_);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->Kfe_);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->Kte_);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->Kfv_);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->Ktv_);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->KfeRopes_);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->KteRopes_);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->KfvRopes_);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->KtvRopes_);
  this->withForceMeasurements_ = false;
  this->withComBias_ = false;
  this->withAbsolutePos_ = false;
  this->withUnmodeledForces_ = false;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&this->pe);
  this->marginalStabilityFactor_ = 0.9999;
  Optimization::Optimization(&this->op_);
  local_4c = 40000;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*(&local_48,&local_4c,local_4f);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,3,3,0,3,3> *)&this->Kfe_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_48);
  local_74 = 600;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*(&local_70,&local_74,local_77);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,3,3,0,3,3> *)&this->Kte_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_70);
  local_9c = 600;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*(&local_98,&local_9c,local_9f);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,3,3,0,3,3> *)&this->Kfv_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_98);
  local_c4 = 0x3c;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*(&local_c0,&local_c4,local_c7);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,3,3,0,3,3> *)&this->Ktv_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_c0);
  local_ec = 40000;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*(&local_e8,&local_ec,local_ef);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,3,3,0,3,3> *)&this->KfeRopes_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_e8);
  local_114 = 600;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*(&local_110,&local_114,local_117);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,3,3,0,3,3> *)&this->KteRopes_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_110);
  local_13c = 600;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*(&local_138,&local_13c,local_13f);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,3,3,0,3,3> *)&this->KfvRopes_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_138);
  local_164 = 0x3c;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*(&local_160,&local_164,local_167);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,3,3,0,3,3> *)&this->KtvRopes_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&local_160);
  AccelerometerGyrometer::setMatrixMode(&this->sensor_,true);
  this->contactModel_ = 0;
  this->nbContacts_ = 0;
  this->inputSize_ = 0x30;
  this->kcurrent_ = 0xffffffff;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->fc_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,6);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->fc_);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->tc_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,6);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->tc_);
  this->printed_ = false;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->pe);
  return;
}

Assistant:

IMUElasticLocalFrameDynamicalSystem::
    	IMUElasticLocalFrameDynamicalSystem(double dt):
        processNoise_(0x0), dt_(dt),
        robotMass_(hrp2::m),
        robotMassInv_(1/hrp2::m),
        measurementSize_(measurementSizeBase_),
        withForceMeasurements_(false), withComBias_(false), withAbsolutePos_(false),
        withUnmodeledForces_(false),
        marginalStabilityFactor_(0.9999)
    {
#ifdef STATEOBSERVATION_VERBOUS_CONSTRUCTORS
       // std::cout<<std::endl<<"IMUElasticLocalFrameDynamicalSystem Constructor"<<std::endl;

#endif //STATEOBSERVATION_VERBOUS_CONSTRUCTOR
      Kfe_=40000*Matrix3::Identity();
      Kte_=600*Matrix3::Identity();
      Kfv_=600*Matrix3::Identity();
      Ktv_=60*Matrix3::Identity();

      KfeRopes_=40000*Matrix3::Identity();
      KteRopes_=600*Matrix3::Identity();
      KfvRopes_=600*Matrix3::Identity();
      KtvRopes_=60*Matrix3::Identity();

      sensor_.setMatrixMode(true);

      contactModel_=contactModel::none;

      nbContacts_=0;
      inputSize_=input::inputSizeBase;

      kcurrent_=-1;

      fc_.resize(hrp2::contact::nbModeledMax*3); fc_.setZero();
      tc_.resize(hrp2::contact::nbModeledMax*3); tc_.setZero();

      printed_ = false;
      pe.setZero();

    }